

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O3

unsigned_long_long get_big_unsigned(FMFieldPtr field,void *data)

{
  undefined1 uVar1;
  ushort uVar2;
  FMdata_type FVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  unsigned_long_long uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  int i;
  long lVar12;
  void *in_RDX;
  void *data_00;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  longdouble in_ST0;
  unsigned_long tmp;
  unsigned_long_long auStack_30 [2];
  unsigned_long_long local_10 [2];
  
  switch(field->data_type) {
  case integer_type:
    uVar7 = get_big_int(field,data);
    return uVar7;
  case unsigned_type:
  case enumeration_type:
  case boolean_type:
    switch(field->size) {
    case 1:
      local_10[0] = (unsigned_long_long)*(byte *)((long)data + field->offset);
      break;
    case 2:
      uVar2 = *(ushort *)((long)data + field->offset);
      bVar15 = field->byte_swap == '\0';
      uVar6 = (uint)uVar2;
      if (bVar15) {
        uVar6 = (uint)(uVar2 >> 8);
      }
      uVar9 = (uint)(uVar2 >> 8);
      if (bVar15) {
        uVar9 = (uint)uVar2;
      }
      local_10[0] = (unsigned_long_long)(uVar9 & 0xff | (uVar6 & 0xff) << 8);
      break;
    case 4:
      uVar6 = *(uint *)((long)data + field->offset);
      uVar14 = uVar6 >> 8;
      uVar8 = uVar6 >> 0x10;
      uVar5 = uVar6 >> 0x18;
      uVar9 = uVar14;
      if (field->byte_swap != '\0') {
        uVar13 = uVar6 & 0xff;
        uVar9 = uVar8;
        uVar6 = uVar5;
        uVar5 = uVar13;
        uVar8 = uVar14;
      }
      local_10[0] = (unsigned_long_long)
                    (uVar6 & 0xff | (uVar9 & 0xff) << 8 | (uVar8 & 0xff) << 0x10 | uVar5 << 0x18);
      break;
    case 8:
      local_10[0] = *(unsigned_long_long *)((long)data + field->offset);
      if (field->byte_swap != '\0') {
        uVar11 = 0x700000000;
        lVar12 = 0;
        do {
          uVar1 = *(undefined1 *)((long)local_10 + lVar12);
          *(undefined1 *)((long)local_10 + lVar12) =
               *(undefined1 *)((long)local_10 + (uVar11 >> 0x20));
          *(undefined1 *)((long)local_10 + (uVar11 >> 0x20)) = uVar1;
          lVar12 = lVar12 + 1;
          uVar11 = uVar11 - 0x100000000;
        } while (lVar12 != 4);
      }
      break;
    default:
      if (field->size == 0x10) {
        bVar15 = field->byte_swap == '\0';
        sVar10 = field->offset + 8;
        if (bVar15) {
          sVar10 = field->offset;
        }
        local_10[0] = *(unsigned_long_long *)((long)data + sVar10);
        if (bVar15) {
          return *(unsigned_long_long *)((long)data + sVar10);
        }
        uVar11 = 0x700000000;
        lVar12 = 0;
        do {
          uVar1 = *(undefined1 *)((long)local_10 + lVar12);
          *(undefined1 *)((long)local_10 + lVar12) =
               *(undefined1 *)((long)local_10 + (uVar11 >> 0x20));
          *(undefined1 *)((long)local_10 + (uVar11 >> 0x20)) = uVar1;
          lVar12 = lVar12 + 1;
          uVar11 = uVar11 - 0x100000000;
        } while (lVar12 != 4);
        return local_10[0];
      }
    case 3:
    case 5:
    case 6:
    case 7:
      if (get_long_warn == 0) {
        get_big_unsigned_cold_1();
      }
      local_10[0] = 0;
    }
    break;
  case float_type:
    get_big_float((longdouble *)field,(FMFieldPtr)data,in_RDX);
    local_10[0] = (unsigned_long_long)in_ST0;
    break;
  default:
    get_big_unsigned_cold_2();
    FVar3 = field->data_type;
    if (FVar3 == float_type) {
      get_big_float((longdouble *)field,(FMFieldPtr)data,data_00);
      auStack_30[0] = (unsigned_long_long)in_ST0;
    }
    else {
      if (FVar3 == unsigned_type) {
        uVar7 = get_big_unsigned(field,data);
        return uVar7;
      }
      if (FVar3 != integer_type) {
        get_big_int_cold_2();
        uVar7 = get_big_unsigned(field,data);
        return uVar7;
      }
      switch(field->size) {
      case 1:
        auStack_30[0] =
             (unsigned_long_long)*(char *)((long)&((FMFieldPtr)data)->offset + field->offset);
        break;
      case 2:
        uVar2 = *(ushort *)((long)&((FMFieldPtr)data)->offset + field->offset);
        uVar4 = uVar2 >> 8;
        if (field->byte_swap == '\0') {
          uVar4 = uVar2;
          uVar2 = uVar2 >> 8;
        }
        auStack_30[0] = (unsigned_long_long)(short)(uVar4 & 0xff | uVar2 << 8);
        break;
      case 4:
        uVar6 = *(uint *)((long)&((FMFieldPtr)data)->offset + field->offset);
        uVar14 = uVar6 >> 8;
        uVar8 = uVar6 >> 0x10;
        uVar5 = uVar6 >> 0x18;
        uVar9 = uVar14;
        if (field->byte_swap != '\0') {
          uVar13 = uVar6 & 0xff;
          uVar9 = uVar8;
          uVar6 = uVar5;
          uVar5 = uVar13;
          uVar8 = uVar14;
        }
        auStack_30[0] =
             (unsigned_long_long)
             (int)(uVar6 & 0xff | (uVar9 & 0xff) << 8 | (uVar8 & 0xff) << 0x10 | uVar5 << 0x18);
        break;
      case 8:
        auStack_30[0] = *(unsigned_long_long *)((long)&((FMFieldPtr)data)->offset + field->offset);
        if (field->byte_swap != '\0') {
          uVar11 = 0x700000000;
          lVar12 = 0;
          do {
            uVar1 = *(undefined1 *)((long)auStack_30 + lVar12);
            *(undefined1 *)((long)auStack_30 + lVar12) =
                 *(undefined1 *)((long)auStack_30 + (uVar11 >> 0x20));
            *(undefined1 *)((long)auStack_30 + (uVar11 >> 0x20)) = uVar1;
            lVar12 = lVar12 + 1;
            uVar11 = uVar11 - 0x100000000;
          } while (lVar12 != 4);
        }
        break;
      default:
        if (field->size == 0x10) {
          bVar15 = field->byte_swap == '\0';
          sVar10 = field->offset + 8;
          if (bVar15) {
            sVar10 = field->offset;
          }
          auStack_30[0] = *(unsigned_long_long *)((long)&((FMFieldPtr)data)->offset + sVar10);
          if (bVar15) {
            return auStack_30[0];
          }
          uVar11 = 0x700000000;
          lVar12 = 0;
          do {
            uVar1 = *(undefined1 *)((long)auStack_30 + lVar12);
            *(undefined1 *)((long)auStack_30 + lVar12) =
                 *(undefined1 *)((long)auStack_30 + (uVar11 >> 0x20));
            *(undefined1 *)((long)auStack_30 + (uVar11 >> 0x20)) = uVar1;
            lVar12 = lVar12 + 1;
            uVar11 = uVar11 - 0x100000000;
          } while (lVar12 != 4);
          return auStack_30[0];
        }
      case 3:
      case 5:
      case 6:
      case 7:
        auStack_30[0] = 0xffffffffffffffff;
        if (get_long_warn == 0) {
          get_big_int_cold_1();
        }
      }
    }
    return auStack_30[0];
  }
  return local_10[0];
}

Assistant:

static MAX_UNSIGNED_TYPE
get_big_unsigned(FMFieldPtr field, void *data)
{
    if ((field->data_type == unsigned_type) || 
	(field->data_type == enumeration_type) || 
	(field->data_type == boolean_type)) {
	if (field->size == sizeof(char)) {
	    unsigned char tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(char));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(short)) {
	    unsigned short tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(short));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(short));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(int)) {
	    unsigned int tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(int));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(int));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(size_t)) {
	    size_t tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(size_t));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(size_t));
	    return tmp;
	} else if (field->size == 2 * sizeof(long)) {
	    unsigned long tmp;
	    size_t low_bytes_offset = field->offset;
	    if (WORDS_BIGENDIAN) {
		if (!field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    }
	    memcpy(&tmp, (char *) data + low_bytes_offset, sizeof(long));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(long));
	    return tmp;
	} else {
	    if (!get_long_warn) {
		fprintf(stderr, "Get Long failed!  Size problems.  File int size is %d.\n", field->size);
		get_long_warn++;
	    }
	    return 0;
	}
    } else if (field->data_type == integer_type) {
	MAX_INTEGER_TYPE tmp = get_big_int(field, data);
	return (MAX_UNSIGNED_TYPE) tmp;
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp = get_big_float(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_UNSIGNED_TYPE) (long) (double) tmp;
#else
	return (MAX_UNSIGNED_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get IOulong failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}